

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5GetPoslistSize(u8 *p,int *pnSz,int *pbDel)

{
  int iVar1;
  long in_FS_OFFSET;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = (uint)*p;
  if ((char)*p < '\0') {
    iVar1 = sqlite3Fts5GetVarint32(p,&local_24);
  }
  else {
    iVar1 = 1;
  }
  *pnSz = (int)local_24 / 2;
  *pbDel = local_24 & 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar1;
  }
  __stack_chk_fail(2,local_24 & 1,(long)(int)local_24 % 2 & 0xffffffff);
}

Assistant:

static int fts5GetPoslistSize(const u8 *p, int *pnSz, int *pbDel){
  int nSz;
  int n = 0;
  fts5FastGetVarint32(p, n, nSz);
  assert_nc( nSz>=0 );
  *pnSz = nSz/2;
  *pbDel = nSz & 0x0001;
  return n;
}